

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::BuildResultEx(Clipper *this,ExPolygons *polys)

{
  size_type sVar1;
  reference ppOVar2;
  bool bVar3;
  byte local_b1;
  undefined1 local_88 [8];
  Polygon pg;
  OutPt *local_60;
  OutPt *p;
  ExPolygon epg;
  ulong uStack_20;
  int k;
  size_type i;
  ExPolygons *polys_local;
  Clipper *this_local;
  
  uStack_20 = 0;
  epg.holes.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::resize(polys,0);
  sVar1 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::size
                    (&this->m_PolyOuts);
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::reserve(polys,sVar1);
  while( true ) {
    sVar1 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::size
                      (&this->m_PolyOuts);
    bVar3 = false;
    if (uStack_20 < sVar1) {
      ppOVar2 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                          (&this->m_PolyOuts,uStack_20);
      bVar3 = (*ppOVar2)->pts != (OutPt *)0x0;
    }
    if (!bVar3) break;
    ExPolygon::ExPolygon((ExPolygon *)&p);
    ppOVar2 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                        (&this->m_PolyOuts,uStack_20);
    local_60 = (*ppOVar2)->pts;
    do {
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&p,
                 &local_60->pt);
      local_60 = local_60->next;
      ppOVar2 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                          (&this->m_PolyOuts,uStack_20);
    } while (local_60 != (*ppOVar2)->pts);
    uStack_20 = uStack_20 + 1;
    sVar1 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::size
                      ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&p);
    if (sVar1 < 3) {
      pg.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
    }
    else {
      while( true ) {
        sVar1 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::size
                          (&this->m_PolyOuts);
        local_b1 = 0;
        if (uStack_20 < sVar1) {
          ppOVar2 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::
                    operator[](&this->m_PolyOuts,uStack_20);
          local_b1 = 0;
          if ((*ppOVar2)->pts != (OutPt *)0x0) {
            ppOVar2 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::
                      operator[](&this->m_PolyOuts,uStack_20);
            local_b1 = (*ppOVar2)->isHole;
          }
        }
        if ((local_b1 & 1) == 0) break;
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                  ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_88);
        ppOVar2 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::
                  operator[](&this->m_PolyOuts,uStack_20);
        local_60 = (*ppOVar2)->pts;
        do {
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                    ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_88
                     ,&local_60->pt);
          local_60 = local_60->next;
          ppOVar2 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::
                    operator[](&this->m_PolyOuts,uStack_20);
        } while (local_60 != (*ppOVar2)->pts);
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::push_back((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                     *)&epg.outer.
                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_88);
        uStack_20 = uStack_20 + 1;
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
                  ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_88);
      }
      std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::push_back
                (polys,(value_type *)&p);
      epg.holes.
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           epg.holes.
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      pg.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    }
    ExPolygon::~ExPolygon((ExPolygon *)&p);
  }
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::resize
            (polys,(long)epg.holes.
                         super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  return;
}

Assistant:

void Clipper::BuildResultEx(ExPolygons &polys)
{
  PolyOutList::size_type i = 0;
  int k = 0;
  polys.resize(0);
  polys.reserve(m_PolyOuts.size());
  while (i < m_PolyOuts.size() && m_PolyOuts[i]->pts)
  {
    ExPolygon epg;
    OutPt* p = m_PolyOuts[i]->pts;
    do {
      epg.outer.push_back(p->pt);
      p = p->next;
    } while (p != m_PolyOuts[i]->pts);
    i++;
    //make sure polygons have at least 3 vertices ...
    if (epg.outer.size() < 3) continue;
    while (i < m_PolyOuts.size()
      && m_PolyOuts[i]->pts && m_PolyOuts[i]->isHole)
    {
      Polygon pg;
      p = m_PolyOuts[i]->pts;
      do {
        pg.push_back(p->pt);
        p = p->next;
      } while (p != m_PolyOuts[i]->pts);
      epg.holes.push_back(pg);
      i++;
    }
    polys.push_back(epg);
    k++;
  }
  polys.resize(k);
}